

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

bool vkt::sr::anon_unknown_0::verifyConstantDerivate
               (TestLog *log,ConstPixelBufferAccess *result,PixelBufferAccess *errorMask,
               DataType dataType,Vec4 *reference,Vec4 *threshold,Vec4 *scale,Vec4 *bias,
               VerificationLogging logPolicy)

{
  float fVar1;
  int iVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_718;
  MessageBuilder local_598;
  deUint32 local_414;
  Vec4 local_410;
  Vector<float,_4> local_400;
  Vec4 local_3f0;
  LogVecComps local_3e0;
  LogVecComps local_3d0;
  MessageBuilder local_3c0;
  Vector<bool,_4> local_240;
  Vector<float,_4> local_23c;
  Vector<float,_4> local_22c;
  Vector<bool,_4> local_219;
  Vector<bool,_4> local_215;
  undefined1 local_211;
  undefined1 local_210 [7];
  bool isOk;
  Vec4 resDerivate;
  int x;
  int y;
  LogVecComps local_1e8 [2];
  MessageBuilder local_1c8;
  int local_48;
  Vector<bool,_4> local_44;
  int numFailedPixels;
  DataType local_3c;
  BVec4 mask;
  int numComps;
  Vec4 *threshold_local;
  Vec4 *reference_local;
  DataType dataType_local;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *result_local;
  TestLog *log_local;
  
  _mask = threshold;
  local_3c = glu::getDataTypeFloatScalars(dataType);
  getDerivateMask((anon_unknown_0 *)&local_44,dataType);
  tcu::logicalNot<bool,4>((tcu *)&numFailedPixels,&local_44);
  local_48 = 0;
  if (logPolicy == LOG_ALL) {
    tcu::TestLog::operator<<(&local_1c8,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [11])0x137c542);
    LogVecComps::LogVecComps(local_1e8,reference,local_3c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1e8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [17])" with threshold ");
    LogVecComps::LogVecComps((LogVecComps *)&x,_mask,local_3c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(LogVecComps *)&x);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  }
  resDerivate.m_data[3] = 0.0;
  while( true ) {
    fVar1 = resDerivate.m_data[3];
    iVar2 = tcu::ConstPixelBufferAccess::getHeight(result);
    if (iVar2 <= (int)fVar1) break;
    resDerivate.m_data[2] = 0.0;
    while( true ) {
      fVar1 = resDerivate.m_data[2];
      iVar2 = tcu::ConstPixelBufferAccess::getWidth(result);
      if (iVar2 <= (int)fVar1) break;
      readDerivate((anon_unknown_0 *)local_210,result,scale,bias,(int)resDerivate.m_data[2],
                   (int)resDerivate.m_data[3]);
      tcu::operator-((tcu *)&local_23c,reference,(Vector<float,_4> *)local_210);
      tcu::abs<float,4>((tcu *)&local_22c,&local_23c);
      tcu::lessThanEqual<float,4>((tcu *)&local_219,&local_22c,_mask);
      tcu::logicalOr<bool,4>((tcu *)&local_215,&local_219,(Vector<bool,_4> *)&numFailedPixels);
      tcu::Vector<bool,_4>::Vector(&local_240,true);
      local_211 = tcu::allEqual<bool,4>(&local_215,&local_240);
      if (!(bool)local_211) {
        if ((local_48 < 10) && (logPolicy == LOG_ALL)) {
          tcu::TestLog::operator<<(&local_3c0,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar3 = tcu::MessageBuilder::operator<<(&local_3c0,(char (*) [11])"FAIL: got ");
          LogVecComps::LogVecComps(&local_3d0,(Vec4 *)local_210,local_3c);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3d0);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])", diff = ");
          tcu::operator-((tcu *)&local_400,reference,(Vector<float,_4> *)local_210);
          tcu::abs<float,4>((tcu *)&local_3f0,&local_400);
          LogVecComps::LogVecComps(&local_3e0,&local_3f0,local_3c);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3e0);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])", at x = ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)(resDerivate.m_data + 2));
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])", y = ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)(resDerivate.m_data + 3));
          tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_3c0);
        }
        local_48 = local_48 + 1;
        local_414 = (deUint32)tcu::RGBA::red();
        tcu::RGBA::toVec((RGBA *)&local_410);
        tcu::PixelBufferAccess::setPixel
                  (errorMask,&local_410,(int)resDerivate.m_data[2],(int)resDerivate.m_data[3],0);
      }
      resDerivate.m_data[2] = (float)((int)resDerivate.m_data[2] + 1);
    }
    resDerivate.m_data[3] = (float)((int)resDerivate.m_data[3] + 1);
  }
  if ((9 < local_48) && (logPolicy == LOG_ALL)) {
    tcu::TestLog::operator<<(&local_598,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_598,(char (*) [4])"...");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_598);
  }
  if ((0 < local_48) && (logPolicy == LOG_ALL)) {
    tcu::TestLog::operator<<(&local_718,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_718,(char (*) [13])"FAIL: found ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_48);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])" failed pixels");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_718);
  }
  return local_48 == 0;
}

Assistant:

static bool verifyConstantDerivate (tcu::TestLog&						log,
									const tcu::ConstPixelBufferAccess&	result,
									const tcu::PixelBufferAccess&		errorMask,
									glu::DataType						dataType,
									const tcu::Vec4&					reference,
									const tcu::Vec4&					threshold,
									const tcu::Vec4&					scale,
									const tcu::Vec4&					bias,
									VerificationLogging					logPolicy = LOG_ALL)
{
	const int			numComps		= glu::getDataTypeFloatScalars(dataType);
	const tcu::BVec4	mask			= tcu::logicalNot(getDerivateMask(dataType));
	int					numFailedPixels	= 0;

	if (logPolicy == LOG_ALL)
		log << TestLog::Message << "Expecting " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps) << TestLog::EndMessage;

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			const tcu::Vec4		resDerivate		= readDerivate(result, scale, bias, x, y);
			const bool			isOk			= tcu::allEqual(tcu::logicalOr(tcu::lessThanEqual(tcu::abs(reference - resDerivate), threshold), mask), tcu::BVec4(true));

			if (!isOk)
			{
				if (numFailedPixels < MAX_FAILED_MESSAGES && logPolicy == LOG_ALL)
					log << TestLog::Message << "FAIL: got " << LogVecComps(resDerivate, numComps)
											<< ", diff = " << LogVecComps(tcu::abs(reference - resDerivate), numComps)
											<< ", at x = " << x << ", y = " << y
						<< TestLog::EndMessage;
				numFailedPixels += 1;
				errorMask.setPixel(tcu::RGBA::red().toVec(), x, y);
			}
		}
	}

	if (numFailedPixels >= MAX_FAILED_MESSAGES && logPolicy == LOG_ALL)
		log << TestLog::Message << "..." << TestLog::EndMessage;

	if (numFailedPixels > 0 && logPolicy == LOG_ALL)
		log << TestLog::Message << "FAIL: found " << numFailedPixels << " failed pixels" << TestLog::EndMessage;

	return numFailedPixels == 0;
}